

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.cc
# Opt level: O3

void __thiscall
testing::Matcher<std::basic_string_view<char,_std::char_traits<char>_>_>::Matcher
          (Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> *this,char *s)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  allocator<char> local_71;
  Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> local_70;
  long *local_58;
  long local_50;
  long local_48 [2];
  long *local_38 [2];
  long local_28 [2];
  
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001507a8;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,s,&local_71);
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>((string *)local_38,local_58,local_50 + (long)local_58);
  internal::ComparisonBase::operator_cast_to_Matcher(&local_70,(ComparisonBase *)local_38);
  _Var2._M_pi = local_70.super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>.
                impl_.
                super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  peVar1 = local_70.super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>.impl_.
           super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_70.super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_70.super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).impl_.
            super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar1;
  (this->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var2._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_70.super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00150a60;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    local_70.super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>.
    _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00150a60;
    if (local_70.super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>.impl_.
        super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>.
                 impl_.
                 super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

Matcher<internal::StringView>::Matcher(const char* s) {
  *this = Eq(std::string(s));
}